

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_foreach_event_(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  event_base_foreach_event_cb p_Stack_38;
  int r;
  evmap_foreach_event_helper h;
  void *arg_local;
  event_base_foreach_event_cb fn_local;
  event_base *base_local;
  
  p_Stack_38 = fn;
  h.fn = (event_base_foreach_event_cb)arg;
  h.arg = arg;
  base_local._4_4_ = evmap_io_foreach_fd(base,evmap_io_foreach_event_fn,&stack0xffffffffffffffc8);
  if (base_local._4_4_ == 0) {
    base_local._4_4_ =
         evmap_signal_foreach_signal(base,evmap_signal_foreach_event_fn,&stack0xffffffffffffffc8);
  }
  return base_local._4_4_;
}

Assistant:

int
evmap_foreach_event_(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	struct evmap_foreach_event_helper h;
	int r;
	h.fn = fn;
	h.arg = arg;
	if ((r = evmap_io_foreach_fd(base, evmap_io_foreach_event_fn, &h)))
		return r;
	return evmap_signal_foreach_signal(base, evmap_signal_foreach_event_fn, &h);
}